

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

size_t WriteMetadataHeader(BrotliEncoderState *s,size_t block_size,uint8_t *header)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  int local_1bc;
  uint32_t nbytes;
  uint32_t nbits;
  size_t storage_ix;
  uint8_t *header_local;
  size_t block_size_local;
  BrotliEncoderState *s_local;
  uint64_t v_5;
  uint8_t *p_5;
  uint32_t *local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  uint64_t v_4;
  uint8_t *p_4;
  uint32_t *local_148;
  ulong local_140;
  undefined8 local_138;
  uint64_t v_3;
  uint8_t *p_3;
  ulong local_100;
  uint64_t v_2;
  uint8_t *p_2;
  uint32_t *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  ulong local_d0;
  uint64_t v_1;
  uint8_t *p_1;
  uint32_t *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  ulong local_a0;
  uint64_t v;
  uint8_t *p;
  uint32_t *local_88;
  undefined8 local_80;
  undefined8 local_78;
  ulong local_70;
  ulong local_68;
  ulong *local_60;
  ulong local_58;
  ulong *local_50;
  ulong local_48;
  ulong *local_40;
  ulong local_28;
  ulong *local_20;
  
  bVar1 = s->last_byte_bits_;
  uVar3 = (ulong)bVar1;
  *header = s->last_byte_;
  s->last_byte_ = '\0';
  s->last_byte_bits_ = '\0';
  local_78 = 1;
  local_80 = 0;
  local_88 = &nbytes;
  v = (uint64_t)(header + (bVar1 >> 3));
  local_a0 = 0L << (bVar1 & 7) | (ulong)(byte)*(ulong *)v;
  *(ulong *)v = local_a0;
  local_a8 = 2;
  local_b0 = 3;
  local_b8 = &nbytes;
  v_1 = (uint64_t)(header + (uVar3 + 1 >> 3));
  local_d0 = 3L << ((byte)(uVar3 + 1) & 7) | (ulong)(byte)*(ulong *)v_1;
  *(ulong *)v_1 = local_d0;
  local_d8 = 1;
  local_e0 = 0;
  local_e8 = &nbytes;
  v_2 = (uint64_t)(header + (uVar3 + 3 >> 3));
  local_100 = 0L << ((byte)(uVar3 + 3) & 7) | (ulong)(byte)*(ulong *)v_2;
  *(ulong *)v_2 = local_100;
  _nbytes = uVar3 + 4;
  if (block_size == 0) {
    *(ulong *)(header + (_nbytes >> 3)) =
         0L << ((byte)_nbytes & 7) | (ulong)(byte)*(ulong *)(header + (_nbytes >> 3));
    _nbytes = uVar3 + 6;
  }
  else {
    if (block_size == 1) {
      local_1bc = 0;
    }
    else {
      uVar2 = (int)block_size - 1;
      local_70 = (ulong)uVar2;
      local_1bc = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> local_1bc == 0; local_1bc = local_1bc + -1) {
        }
      }
      local_1bc = local_1bc + 1;
    }
    uVar2 = local_1bc + 7U >> 3;
    local_140 = (ulong)uVar2;
    local_138 = 2;
    local_148 = &nbytes;
    v_4 = (uint64_t)(header + (_nbytes >> 3));
    local_160 = (ulong)(byte)*(ulong *)v_4;
    storage_ix = (size_t)header;
    header_local = (uint8_t *)block_size;
    block_size_local = (size_t)s;
    p_4 = header;
    p_2 = header;
    p_1 = header;
    p = header;
    local_68 = local_a0;
    local_60 = (ulong *)v;
    local_58 = local_d0;
    local_50 = (ulong *)v_1;
    local_48 = local_100;
    local_40 = (ulong *)v_2;
    if (local_1bc + 7U >> 5 != 0) {
      __assert_fail("(bits >> n_bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                    ,0x36,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    local_160 = local_140 << ((byte)_nbytes & 7) | local_160;
    *(ulong *)v_4 = local_160;
    _nbytes = uVar3 + 6;
    uVar2 = uVar2 << 3;
    local_168 = (ulong)uVar2;
    local_170 = block_size - 1;
    local_178 = &nbytes;
    v_5 = (uint64_t)(header + (_nbytes >> 3));
    s_local = (BrotliEncoderState *)(ulong)(byte)*(ulong *)v_5;
    p_5 = header;
    local_28 = local_160;
    local_20 = (ulong *)v_4;
    if (local_170 >> ((byte)uVar2 & 0x3f) != 0) {
      __assert_fail("(bits >> n_bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                    ,0x36,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    if (0x38 < local_168) {
      __assert_fail("n_bits <= 56",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                    ,0x37,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    *(ulong *)v_5 = local_170 << ((byte)_nbytes & 7) | (ulong)s_local;
    _nbytes = local_168 + _nbytes;
  }
  return _nbytes + 7 >> 3;
}

Assistant:

static size_t WriteMetadataHeader(
    BrotliEncoderState* s, const size_t block_size, uint8_t* header) {
  size_t storage_ix;
  storage_ix = s->last_byte_bits_;
  header[0] = s->last_byte_;
  s->last_byte_ = 0;
  s->last_byte_bits_ = 0;

  BrotliWriteBits(1, 0, &storage_ix, header);
  BrotliWriteBits(2, 3, &storage_ix, header);
  BrotliWriteBits(1, 0, &storage_ix, header);
  if (block_size == 0) {
    BrotliWriteBits(2, 0, &storage_ix, header);
  } else {
    uint32_t nbits = (block_size == 1) ? 0 :
        (Log2FloorNonZero((uint32_t)block_size - 1) + 1);
    uint32_t nbytes = (nbits + 7) / 8;
    BrotliWriteBits(2, nbytes, &storage_ix, header);
    BrotliWriteBits(8 * nbytes, block_size - 1, &storage_ix, header);
  }
  return (storage_ix + 7u) >> 3;
}